

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::
ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
::truncate(ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
           *this,char *__file,__off_t __length)

{
  Entry *pEVar1;
  Entry *pEVar2;
  uint *puVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  
  pEVar1 = this->ptr;
  pEVar2 = this->pos;
  while (pEVar1 + (long)__file < pEVar2) {
    this->pos = pEVar2 + -1;
    puVar3 = pEVar2[-1].value.paramExports.ptr;
    if (puVar3 != (uint *)0x0) {
      sVar4 = pEVar2[-1].value.paramExports.size_;
      pEVar2[-1].value.paramExports.ptr = (uint *)0x0;
      pEVar2[-1].value.paramExports.size_ = 0;
      pAVar5 = pEVar2[-1].value.paramExports.disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,puVar3,4,sVar4,sVar4,0);
    }
    pEVar2 = this->pos;
  }
  return (int)pEVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }